

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Iemit,Float scale,Image *im,Allocator alloc)

{
  Tuple2<pbrt::Point2,_int> TVar1;
  PiecewiseConstant1D *pPVar2;
  size_t sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  memory_resource *pmVar20;
  Allocator alloc_00;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  span<const_float> func;
  Array2D<float> d;
  int va;
  undefined1 auStack_ac [12];
  Tuple2<pbrt::Point2,_float> TStack_a8;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  local_a0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_80;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_60;
  Float local_40;
  Float FStack_3c;
  Float local_38;
  
  (this->super_LightBase).type = DeltaPosition;
  uVar4 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar5 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar6 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar7 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar8 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar9 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar10 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar12 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar14 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar16 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar18 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar4;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar5;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar7;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar8;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar9;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar18;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  *(long *)(in_FS_OFFSET + -0x228) = *(long *)(in_FS_OFFSET + -0x228) + 1;
  TStack_a8 = _va;
  _va = (Tuple2<pbrt::Point2,_float>)
        (Iemit->
        super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
        ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Iemit,(SpectrumHandle *)&va,0x168,0x33e,alloc);
  this->scale = scale;
  iVar19 = (im->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = im->format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar19;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (im->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  (this->image).channelNames.alloc.memoryResource = (im->channelNames).alloc.memoryResource;
  (this->image).channelNames.nStored = 0;
  (this->image).channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (this->image).channelNames.nAlloc = 0;
  sVar3 = (im->channelNames).nStored;
  (this->image).channelNames.nAlloc = (im->channelNames).nAlloc;
  (this->image).channelNames.nStored = sVar3;
  (this->image).channelNames.ptr = (im->channelNames).ptr;
  (im->channelNames).nStored = 0;
  (im->channelNames).ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (im->channelNames).nAlloc = 0;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar20 = (im->p8).alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (im->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar20;
  (this->image).p8.ptr = (uchar *)0x0;
  (this->image).p8.nAlloc = 0;
  (this->image).p8.nStored = 0;
  sVar3 = (im->p8).nStored;
  (this->image).p8.nAlloc = (im->p8).nAlloc;
  (this->image).p8.nStored = sVar3;
  (this->image).p8.ptr = (im->p8).ptr;
  (im->p8).nStored = 0;
  (im->p8).ptr = (uchar *)0x0;
  (im->p8).nAlloc = 0;
  (this->image).p16.alloc.memoryResource = (im->p16).alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)0x0;
  (this->image).p16.nAlloc = 0;
  sVar3 = (im->p16).nStored;
  (this->image).p16.nAlloc = (im->p16).nAlloc;
  (this->image).p16.nStored = sVar3;
  (this->image).p16.ptr = (im->p16).ptr;
  (im->p16).nStored = 0;
  (im->p16).ptr = (Half *)0x0;
  (im->p16).nAlloc = 0;
  (this->image).p32.alloc.memoryResource = (im->p32).alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)0x0;
  (this->image).p32.nAlloc = 0;
  sVar3 = (im->p32).nStored;
  (this->image).p32.nAlloc = (im->p32).nAlloc;
  (this->image).p32.nStored = sVar3;
  (this->image).p32.ptr = (im->p32).ptr;
  (im->p32).nStored = 0;
  (im->p32).ptr = (float *)0x0;
  (im->p32).nAlloc = 0;
  (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0x7f7fffff7f7fffff;
  (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)0xff7fffffff7fffff;
  (this->distrib).pConditionalV.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pConditionalV.ptr = (PiecewiseConstant1D *)0x0;
  (this->distrib).pConditionalV.nAlloc = 0;
  (this->distrib).pConditionalV.nStored = 0;
  (this->distrib).pMarginal.func.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.func.ptr = (float *)0x0;
  (this->distrib).pMarginal.func.nAlloc = 0;
  (this->distrib).pMarginal.func.nStored = 0;
  (this->distrib).pMarginal.cdf.alloc.memoryResource = alloc.memoryResource;
  (this->distrib).pMarginal.cdf.ptr = (float *)0x0;
  (this->distrib).pMarginal.cdf.nAlloc = 0;
  (this->distrib).pMarginal.cdf.nStored = 0;
  (this->distrib).pMarginal.funcInt = 0.0;
  va = 1;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)(this->image).channelNames.nStored;
  if (d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x != 1) {
    LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x1ea,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2cbe3e8,
               (char (*) [18])"image.NChannels()",(char (*) [2])0x2cbe3e8,&va,
               (char (*) [18])"image.NChannels()",(int *)&d);
  }
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  va = TVar1.x;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = TVar1.y;
  if (va == d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) {
    auVar22._8_4_ = 0x3f800000;
    auVar22._0_8_ = 0x3f8000003f800000;
    auVar22._12_4_ = 0x3f800000;
    _va = (Bounds2f)vpunpcklqdq_avx((undefined1  [16])0x0,auVar22);
    pmVar20 = pstd::pmr::new_delete_resource();
    Image::
    GetSamplingDistribution<pbrt::Image::GetSamplingDistribution()::_lambda(pbrt::Point2<float>)_1_>
              (&d,&this->image,&va,pmVar20);
    alloc_00.memoryResource = pstd::pmr::new_delete_resource();
    auVar23._4_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
    auVar23._0_4_ = d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
    auVar21._8_8_ = 0;
    auVar21._0_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    auVar21._4_4_ = d.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    auVar23._8_8_ = 0;
    auVar21 = vpsubd_avx(auVar21,auVar23);
    func.n = (size_t)(auVar21._4_4_ * auVar21._0_4_);
    func.ptr = d.values;
    PiecewiseConstant2D::PiecewiseConstant2D
              ((PiecewiseConstant2D *)&va,func,auVar21._0_4_,auVar21._4_4_,
               (Bounds2f)(ZEXT816(0x3f8000003f800000) << 0x40),alloc_00);
    (this->distrib).domain.pMin.super_Tuple2<pbrt::Point2,_float> = _va;
    (this->distrib).domain.pMax.super_Tuple2<pbrt::Point2,_float> = TStack_a8;
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::operator=(&(this->distrib).pConditionalV,&local_a0);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->distrib).pMarginal.func,&local_80);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
              (&(this->distrib).pMarginal.cdf,&local_60);
    (this->distrib).pMarginal.funcInt = local_38;
    (this->distrib).pMarginal.min = local_40;
    (this->distrib).pMarginal.max = FStack_3c;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_60);
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_80);
    pstd::
    vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
    ::~vector(&local_a0);
    pPVar2 = (this->distrib).pConditionalV.ptr;
    *(size_t *)(in_FS_OFFSET + -0x220) =
         (this->image).p16.nStored * 2 + (this->image).p8.nStored + *(long *)(in_FS_OFFSET + -0x220)
         + (((pPVar2->cdf).nAlloc + (pPVar2->func).nAlloc) * 4 + 0x50) *
           (this->distrib).pConditionalV.nStored +
         ((this->distrib).pMarginal.func.nAlloc + (this->image).p32.nStored +
         (this->distrib).pMarginal.cdf.nAlloc) * 4;
    Array2D<float>::~Array2D(&d);
    return;
  }
  LogFatal<char_const(&)[21],char_const(&)[21],char_const(&)[21],int&,char_const(&)[21],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
             ,0x1eb,"Check failed: %s == %s with %s = %s, %s = %s",
             (char (*) [21])"image.Resolution().x",(char (*) [21])"image.Resolution().y",
             (char (*) [21])"image.Resolution().x",&va,(char (*) [21])"image.Resolution().y",
             (int *)&d);
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle Iemit, Float scale, Image im,
                                   Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      Iemit(Iemit, alloc),
      scale(scale),
      image(std::move(im)),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    CHECK_EQ(image.Resolution().x, image.Resolution().y);
    // Compute sampling distribution for _GoniometricLight_
    Array2D<Float> d = image.GetSamplingDistribution();
    distrib = PiecewiseConstant2D(d);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}